

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtransposeproxymodel.cpp
# Opt level: O2

void __thiscall
QTransposeProxyModel::setSourceModel(QTransposeProxyModel *this,QAbstractItemModel *newSourceModel)

{
  QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
  *this_00;
  parameter_type pQVar1;
  long lVar2;
  long lVar3;
  ConnectionType type;
  Connection *discIter;
  Connection *connection;
  long in_FS_OFFSET;
  initializer_list<QMetaObject::Connection> args;
  QArrayDataPointer<QMetaObject::Connection> local_e0;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)(this + 8);
  this_00 = (QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
             *)(lVar2 + 0xd8);
  pQVar1 = QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
           ::value(this_00);
  if (pQVar1 != newSourceModel) {
    QAbstractItemModel::beginResetModel((QAbstractItemModel *)this);
    pQVar1 = QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
             ::value(this_00);
    if (pQVar1 != (parameter_type)0x0) {
      connection = *(Connection **)(lVar2 + 0xf0);
      for (lVar3 = *(long *)(lVar2 + 0xf8) << 3; lVar3 != 0; lVar3 = lVar3 + -8) {
        QObject::disconnect(connection);
        connection = connection + 1;
      }
    }
    QList<QMetaObject::Connection>::clear((QList<QMetaObject::Connection> *)(lVar2 + 0xe8));
    QAbstractProxyModel::setSourceModel((QAbstractProxyModel *)this,newSourceModel);
    pQVar1 = QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
             ::value(this_00);
    if (pQVar1 != (parameter_type)0x0) {
      pQVar1 = QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
               ::value(this_00);
      type = (ConnectionType)this;
      QObject::
      connect<void(QAbstractItemModel::*)(QAbstractItemModel::QPrivateSignal),void(QAbstractItemModel::*)()>
                ((Object *)local_c8,(offset_in_QAbstractItemModel_to_subr)pQVar1,
                 (ContextType *)QAbstractItemModel::modelAboutToBeReset,
                 (offset_in_QAbstractItemModel_to_subr *)0x0,type);
      pQVar1 = QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
               ::value(this_00);
      QObject::
      connect<void(QAbstractItemModel::*)(QAbstractItemModel::QPrivateSignal),void(QAbstractItemModel::*)()>
                ((Object *)(local_c8 + 8),(offset_in_QAbstractItemModel_to_subr)pQVar1,
                 (ContextType *)QAbstractItemModel::modelReset,
                 (offset_in_QAbstractItemModel_to_subr *)0x0,type);
      pQVar1 = QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
               ::value(this_00);
      QObject::
      connect<void(QAbstractItemModel::*)(QModelIndex_const&,QModelIndex_const&,QList<int>const&),std::_Bind<void(QTransposeProxyModelPrivate::*(QTransposeProxyModelPrivate*,std::_Placeholder<1>,std::_Placeholder<2>,std::_Placeholder<3>))(QModelIndex_const&,QModelIndex_const&,QList<int>const&)>>
                ((Object *)local_b8,(offset_in_QAbstractItemModel_to_subr)pQVar1,
                 (ContextType *)QAbstractItemModel::dataChanged,
                 (_Bind<void_(QTransposeProxyModelPrivate::*(QTransposeProxyModelPrivate_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(const_QModelIndex_&,_const_QModelIndex_&,_const_QList<int>_&)>
                  *)0x0,type);
      pQVar1 = QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
               ::value(this_00);
      QObject::
      connect<void(QAbstractItemModel::*)(Qt::Orientation,int,int),std::_Bind<void(QTransposeProxyModelPrivate::*(QTransposeProxyModelPrivate*,std::_Placeholder<1>,std::_Placeholder<2>,std::_Placeholder<3>))(Qt::Orientation,int,int)>>
                ((Object *)(local_b8 + 8),(offset_in_QAbstractItemModel_to_subr)pQVar1,
                 (ContextType *)QAbstractItemModel::headerDataChanged,
                 (_Bind<void_(QTransposeProxyModelPrivate::*(QTransposeProxyModelPrivate_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(Qt::Orientation,_int,_int)>
                  *)0x0,type);
      pQVar1 = QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
               ::value(this_00);
      QObject::
      connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),std::_Bind<void(QTransposeProxyModelPrivate::*(QTransposeProxyModelPrivate*,std::_Placeholder<1>,std::_Placeholder<2>,std::_Placeholder<3>))(QModelIndex_const&,int,int)>>
                ((Object *)local_a8,(offset_in_QAbstractItemModel_to_subr)pQVar1,
                 (ContextType *)QAbstractItemModel::columnsAboutToBeInserted,
                 (_Bind<void_(QTransposeProxyModelPrivate::*(QTransposeProxyModelPrivate_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(const_QModelIndex_&,_int,_int)>
                  *)0x0,type);
      pQVar1 = QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
               ::value(this_00);
      QObject::
      connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QModelIndex_const&,int,QAbstractItemModel::QPrivateSignal),std::_Bind<void(QTransposeProxyModelPrivate::*(QTransposeProxyModelPrivate*,std::_Placeholder<1>,std::_Placeholder<2>,std::_Placeholder<3>,std::_Placeholder<4>,std::_Placeholder<5>))(QModelIndex_const&,int,int,QModelIndex_const&,int)>>
                ((Object *)(local_a8 + 8),(offset_in_QAbstractItemModel_to_subr)pQVar1,
                 (ContextType *)QAbstractItemModel::columnsAboutToBeMoved,
                 (_Bind<void_(QTransposeProxyModelPrivate::*(QTransposeProxyModelPrivate_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>,_std::_Placeholder<5>))(const_QModelIndex_&,_int,_int,_const_QModelIndex_&,_int)>
                  *)0x0,type);
      pQVar1 = QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
               ::value(this_00);
      QObject::
      connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),std::_Bind<void(QTransposeProxyModelPrivate::*(QTransposeProxyModelPrivate*,std::_Placeholder<1>,std::_Placeholder<2>,std::_Placeholder<3>))(QModelIndex_const&,int,int)>>
                ((Object *)local_98,(offset_in_QAbstractItemModel_to_subr)pQVar1,
                 (ContextType *)QAbstractItemModel::columnsAboutToBeRemoved,
                 (_Bind<void_(QTransposeProxyModelPrivate::*(QTransposeProxyModelPrivate_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(const_QModelIndex_&,_int,_int)>
                  *)0x0,type);
      pQVar1 = QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
               ::value(this_00);
      QObject::
      connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QAbstractItemModel::*)()>
                ((Object *)(local_98 + 8),(offset_in_QAbstractItemModel_to_subr)pQVar1,
                 (ContextType *)QAbstractItemModel::columnsInserted,
                 (offset_in_QAbstractItemModel_to_subr *)0x0,type);
      pQVar1 = QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
               ::value(this_00);
      QObject::
      connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QAbstractItemModel::*)()>
                ((Object *)local_88,(offset_in_QAbstractItemModel_to_subr)pQVar1,
                 (ContextType *)QAbstractItemModel::columnsRemoved,
                 (offset_in_QAbstractItemModel_to_subr *)0x0,type);
      pQVar1 = QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
               ::value(this_00);
      QObject::
      connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QModelIndex_const&,int,QAbstractItemModel::QPrivateSignal),void(QAbstractItemModel::*)()>
                ((Object *)(local_88 + 8),(offset_in_QAbstractItemModel_to_subr)pQVar1,
                 (ContextType *)QAbstractItemModel::columnsMoved,
                 (offset_in_QAbstractItemModel_to_subr *)0x0,type);
      pQVar1 = QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
               ::value(this_00);
      QObject::
      connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),std::_Bind<void(QTransposeProxyModelPrivate::*(QTransposeProxyModelPrivate*,std::_Placeholder<1>,std::_Placeholder<2>,std::_Placeholder<3>))(QModelIndex_const&,int,int)>>
                ((Object *)local_78,(offset_in_QAbstractItemModel_to_subr)pQVar1,
                 (ContextType *)QAbstractItemModel::rowsAboutToBeInserted,
                 (_Bind<void_(QTransposeProxyModelPrivate::*(QTransposeProxyModelPrivate_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(const_QModelIndex_&,_int,_int)>
                  *)0x0,type);
      pQVar1 = QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
               ::value(this_00);
      QObject::
      connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QModelIndex_const&,int,QAbstractItemModel::QPrivateSignal),std::_Bind<void(QTransposeProxyModelPrivate::*(QTransposeProxyModelPrivate*,std::_Placeholder<1>,std::_Placeholder<2>,std::_Placeholder<3>,std::_Placeholder<4>,std::_Placeholder<5>))(QModelIndex_const&,int,int,QModelIndex_const&,int)>>
                ((Object *)(local_78 + 8),(offset_in_QAbstractItemModel_to_subr)pQVar1,
                 (ContextType *)QAbstractItemModel::rowsAboutToBeMoved,
                 (_Bind<void_(QTransposeProxyModelPrivate::*(QTransposeProxyModelPrivate_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>,_std::_Placeholder<5>))(const_QModelIndex_&,_int,_int,_const_QModelIndex_&,_int)>
                  *)0x0,type);
      pQVar1 = QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
               ::value(this_00);
      QObject::
      connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),std::_Bind<void(QTransposeProxyModelPrivate::*(QTransposeProxyModelPrivate*,std::_Placeholder<1>,std::_Placeholder<2>,std::_Placeholder<3>))(QModelIndex_const&,int,int)>>
                ((Object *)local_68,(offset_in_QAbstractItemModel_to_subr)pQVar1,
                 (ContextType *)QAbstractItemModel::rowsAboutToBeRemoved,
                 (_Bind<void_(QTransposeProxyModelPrivate::*(QTransposeProxyModelPrivate_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(const_QModelIndex_&,_int,_int)>
                  *)0x0,type);
      pQVar1 = QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
               ::value(this_00);
      QObject::
      connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QAbstractItemModel::*)()>
                ((Object *)(local_68 + 8),(offset_in_QAbstractItemModel_to_subr)pQVar1,
                 (ContextType *)QAbstractItemModel::rowsInserted,
                 (offset_in_QAbstractItemModel_to_subr *)0x0,type);
      pQVar1 = QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
               ::value(this_00);
      QObject::
      connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QAbstractItemModel::*)()>
                ((Object *)local_58,(offset_in_QAbstractItemModel_to_subr)pQVar1,
                 (ContextType *)QAbstractItemModel::rowsRemoved,
                 (offset_in_QAbstractItemModel_to_subr *)0x0,type);
      pQVar1 = QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
               ::value(this_00);
      QObject::
      connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QModelIndex_const&,int,QAbstractItemModel::QPrivateSignal),void(QAbstractItemModel::*)()>
                ((Object *)(local_58 + 8),(offset_in_QAbstractItemModel_to_subr)pQVar1,
                 (ContextType *)QAbstractItemModel::rowsMoved,
                 (offset_in_QAbstractItemModel_to_subr *)0x0,type);
      pQVar1 = QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
               ::value(this_00);
      QObject::
      connect<void(QAbstractItemModel::*)(QList<QPersistentModelIndex>const&,QAbstractItemModel::LayoutChangeHint),std::_Bind<void(QTransposeProxyModelPrivate::*(QTransposeProxyModelPrivate*,std::_Placeholder<1>,std::_Placeholder<2>))(QList<QPersistentModelIndex>const&,QAbstractItemModel::LayoutChangeHint)>>
                ((Object *)local_48,(offset_in_QAbstractItemModel_to_subr)pQVar1,
                 (ContextType *)QAbstractItemModel::layoutAboutToBeChanged,
                 (_Bind<void_(QTransposeProxyModelPrivate::*(QTransposeProxyModelPrivate_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_QList<QPersistentModelIndex>_&,_QAbstractItemModel::LayoutChangeHint)>
                  *)0x0,type);
      pQVar1 = QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
               ::value(this_00);
      QObject::
      connect<void(QAbstractItemModel::*)(QList<QPersistentModelIndex>const&,QAbstractItemModel::LayoutChangeHint),std::_Bind<void(QTransposeProxyModelPrivate::*(QTransposeProxyModelPrivate*,std::_Placeholder<1>,std::_Placeholder<2>))(QList<QPersistentModelIndex>const&,QAbstractItemModel::LayoutChangeHint)>>
                ((Object *)(local_48 + 8),(offset_in_QAbstractItemModel_to_subr)pQVar1,
                 (ContextType *)QAbstractItemModel::layoutChanged,
                 (_Bind<void_(QTransposeProxyModelPrivate::*(QTransposeProxyModelPrivate_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_QList<QPersistentModelIndex>_&,_QAbstractItemModel::LayoutChangeHint)>
                  *)0x0,type);
      args._M_len = 0x12;
      args._M_array = (iterator)local_c8;
      QList<QMetaObject::Connection>::QList((QList<QMetaObject::Connection> *)&local_e0,args);
      QArrayDataPointer<QMetaObject::Connection>::operator=
                ((QArrayDataPointer<QMetaObject::Connection> *)(lVar2 + 0xe8),&local_e0);
      QArrayDataPointer<QMetaObject::Connection>::~QArrayDataPointer(&local_e0);
      lVar2 = 0x88;
      do {
        QMetaObject::Connection::~Connection((Connection *)(local_c8 + lVar2));
        lVar2 = lVar2 + -8;
      } while (lVar2 != -8);
    }
    QAbstractItemModel::endResetModel((QAbstractItemModel *)this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTransposeProxyModel::setSourceModel(QAbstractItemModel* newSourceModel)
{
    Q_D(QTransposeProxyModel);
    if (newSourceModel == d->model)
        return;
    beginResetModel();
    if (d->model) {
        for (const QMetaObject::Connection& discIter : std::as_const(d->sourceConnections))
            disconnect(discIter);
    }
    d->sourceConnections.clear();
    QAbstractProxyModel::setSourceModel(newSourceModel);
    if (d->model) {
        using namespace std::placeholders;
        d->sourceConnections = QList<QMetaObject::Connection>{
            connect(d->model, &QAbstractItemModel::modelAboutToBeReset, this, &QTransposeProxyModel::beginResetModel),
            connect(d->model, &QAbstractItemModel::modelReset, this, &QTransposeProxyModel::endResetModel),
            connect(d->model, &QAbstractItemModel::dataChanged, this, std::bind(&QTransposeProxyModelPrivate::onDataChanged, d, _1, _2, _3)),
            connect(d->model, &QAbstractItemModel::headerDataChanged, this, std::bind(&QTransposeProxyModelPrivate::onHeaderDataChanged, d, _1, _2, _3)),
            connect(d->model, &QAbstractItemModel::columnsAboutToBeInserted, this, std::bind(&QTransposeProxyModelPrivate::onColumnsAboutToBeInserted, d, _1, _2, _3)),
            connect(d->model, &QAbstractItemModel::columnsAboutToBeMoved, this, std::bind(&QTransposeProxyModelPrivate::onColumnsAboutToBeMoved, d, _1, _2, _3, _4, _5)),
            connect(d->model, &QAbstractItemModel::columnsAboutToBeRemoved, this, std::bind(&QTransposeProxyModelPrivate::onColumnsAboutToBeRemoved, d, _1, _2, _3)),
            connect(d->model, &QAbstractItemModel::columnsInserted, this, &QTransposeProxyModel::endInsertRows),
            connect(d->model, &QAbstractItemModel::columnsRemoved, this, &QTransposeProxyModel::endRemoveRows),
            connect(d->model, &QAbstractItemModel::columnsMoved, this, &QTransposeProxyModel::endMoveRows),
            connect(d->model, &QAbstractItemModel::rowsAboutToBeInserted, this, std::bind(&QTransposeProxyModelPrivate::onRowsAboutToBeInserted, d, _1, _2, _3)),
            connect(d->model, &QAbstractItemModel::rowsAboutToBeMoved, this, std::bind(&QTransposeProxyModelPrivate::onRowsAboutToBeMoved, d, _1, _2, _3, _4, _5)),
            connect(d->model, &QAbstractItemModel::rowsAboutToBeRemoved, this, std::bind(&QTransposeProxyModelPrivate::onRowsAboutToBeRemoved, d, _1, _2, _3)),
            connect(d->model, &QAbstractItemModel::rowsInserted, this, &QTransposeProxyModel::endInsertColumns),
            connect(d->model, &QAbstractItemModel::rowsRemoved, this, &QTransposeProxyModel::endRemoveColumns),
            connect(d->model, &QAbstractItemModel::rowsMoved, this, &QTransposeProxyModel::endMoveColumns),
            connect(d->model, &QAbstractItemModel::layoutAboutToBeChanged, this, std::bind(&QTransposeProxyModelPrivate::onLayoutAboutToBeChanged, d, _1, _2)),
            connect(d->model, &QAbstractItemModel::layoutChanged, this, std::bind(&QTransposeProxyModelPrivate::onLayoutChanged, d, _1, _2))
        };
    }
    endResetModel();
}